

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mult.hpp
# Opt level: O1

void calc_mean_and_sd_weighted<double,int,std::vector<double,std::allocator<double>>,double>
               (size_t *ix_arr,size_t st,size_t end,size_t col_num,double *Xc,int *Xc_ind,
               int *Xc_indptr,double *x_sd,double *x_mean,vector<double,_std::allocator<double>_> *w
               )

{
  int *piVar1;
  double dVar2;
  double __x;
  int iVar3;
  int iVar4;
  pointer pdVar5;
  bool bVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong *puVar12;
  ulong *puVar13;
  int *piVar14;
  long lVar15;
  double __z;
  double dVar16;
  double dVar17;
  double __z_00;
  
  lVar15 = (long)Xc_indptr[col_num];
  lVar7 = (long)Xc_indptr[col_num + 1];
  if (Xc_indptr[col_num] == Xc_indptr[col_num + 1]) {
    *x_sd = 0.0;
    *x_mean = 0.0;
  }
  else {
    puVar13 = ix_arr + st;
    puVar12 = ix_arr + end + 1;
    uVar9 = (long)puVar12 - (long)puVar13 >> 3;
    if (0 < (long)uVar9) {
      do {
        uVar8 = uVar9 >> 1;
        uVar11 = ~uVar8 + uVar9;
        uVar9 = uVar8;
        if ((puVar13 + uVar8 + 1)[-1] < (ulong)(long)Xc_ind[lVar15]) {
          puVar13 = puVar13 + uVar8 + 1;
          uVar9 = uVar11;
        }
      } while (0 < (long)uVar9);
    }
    dVar17 = 0.0;
    dVar16 = 0.0;
    if (st <= end) {
      do {
        dVar16 = dVar16 + (w->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data._M_start[ix_arr[st]];
        st = st + 1;
      } while (st <= end);
    }
    if ((puVar13 == puVar12) || (lVar7 == lVar15)) {
      __z = 0.0;
      __z_00 = 0.0;
    }
    else {
      iVar3 = Xc_ind[lVar7 + -1];
      pdVar5 = (w->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      __z = 0.0;
      __z_00 = 0.0;
      dVar17 = 0.0;
      while (uVar9 = *puVar13, uVar9 <= (ulong)(long)iVar3) {
        piVar1 = Xc_ind + lVar15;
        iVar4 = *piVar1;
        if (iVar4 == (int)uVar9) {
          dVar2 = Xc[lVar15];
          __x = pdVar5[uVar9];
          if ((ulong)ABS(dVar2) < 0x7ff0000000000000) {
            bVar6 = dVar17 == 0.0;
            uVar9 = ~-(ulong)bVar6 & (ulong)__z;
            dVar17 = dVar17 + __x;
            __z = fma(__x,(dVar2 - __z) / dVar17,__z);
            __z_00 = fma(__x,(dVar2 - (double)(uVar9 | -(ulong)bVar6 & (ulong)dVar2)) *
                             (dVar2 - __z),__z_00);
          }
          else {
            dVar16 = dVar16 - __x;
          }
          if ((puVar13 == ix_arr + end) || (lVar15 == lVar7 + -1)) break;
          piVar14 = piVar1 + 1;
          puVar13 = puVar13 + 1;
          uVar9 = (long)Xc_ind + (lVar7 * 4 - (long)piVar14) >> 2;
          if (0 < (long)uVar9) {
            do {
              uVar8 = uVar9 >> 1;
              uVar11 = ~uVar8 + uVar9;
              uVar9 = uVar8;
              if ((ulong)(long)piVar14[uVar8] < *puVar13) {
                piVar14 = piVar14 + uVar8 + 1;
                uVar9 = uVar11;
              }
            } while (0 < (long)uVar9);
          }
LAB_0017c002:
          lVar15 = (long)piVar14 - (long)Xc_ind >> 2;
        }
        else {
          if (iVar4 <= (int)uVar9) {
            piVar14 = piVar1 + 1;
            uVar8 = (long)Xc_ind + (lVar7 * 4 - (long)(piVar1 + 1)) >> 2;
            while (0 < (long)uVar8) {
              uVar11 = uVar8 >> 1;
              uVar10 = ~uVar11 + uVar8;
              uVar8 = uVar11;
              if ((ulong)(long)piVar14[uVar11] < uVar9) {
                piVar14 = piVar14 + uVar11 + 1;
                uVar8 = uVar10;
              }
            }
            goto LAB_0017c002;
          }
          puVar13 = puVar13 + 1;
          uVar9 = (long)puVar12 - (long)puVar13 >> 3;
          while (0 < (long)uVar9) {
            uVar8 = uVar9 >> 1;
            uVar11 = ~uVar8 + uVar9;
            uVar9 = uVar8;
            if ((puVar13 + uVar8 + 1)[-1] < (ulong)(long)iVar4) {
              puVar13 = puVar13 + uVar8 + 1;
              uVar9 = uVar11;
            }
          }
        }
        if ((puVar13 == puVar12) || (lVar15 == lVar7)) break;
      }
    }
    dVar2 = 0.0;
    if ((dVar17 != 0.0) || (NAN(dVar17))) {
      if (dVar17 < dVar16) {
        __z_00 = __z_00 + (1.0 - dVar17 / dVar16) * dVar17 * __z * __z;
        __z = __z * (dVar17 / dVar16);
      }
      *x_mean = __z;
      dVar2 = SQRT(__z_00 / dVar16);
    }
    else {
      *x_mean = 0.0;
    }
    *x_sd = dVar2;
  }
  return;
}

Assistant:

void calc_mean_and_sd_weighted(size_t *restrict ix_arr, size_t st, size_t end, size_t col_num,
                               real_t_ *restrict Xc, sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
                               double &restrict x_sd, double &restrict x_mean, mapping &restrict w)
{
    /* ix_arr must be already sorted beforehand */
    if (Xc_indptr[col_num] == Xc_indptr[col_num + 1])
    {
        x_sd   = 0;
        x_mean = 0;
        return;
    }
    size_t st_col  = Xc_indptr[col_num];
    size_t end_col = Xc_indptr[col_num + 1] - 1;
    size_t curr_pos = st_col;
    size_t ind_end_col = (size_t) Xc_ind[end_col];
    size_t *ptr_st = std::lower_bound(ix_arr + st, ix_arr + end + 1, (size_t)Xc_ind[st_col]);

    ldouble_safe cnt = 0.;
    for (size_t row = st; row <= end; row++)
        cnt += w[ix_arr[row]];
    ldouble_safe added = 0;
    ldouble_safe m = 0;
    ldouble_safe s = 0;
    ldouble_safe m_prev = 0;
    ldouble_safe w_this;

    for (size_t *row = ptr_st;
         row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
        )
    {
        if (Xc_ind[curr_pos] == (sparse_ix)(*row))
        {
            if (unlikely(is_na_or_inf(Xc[curr_pos])))
            {
                cnt -= w[*row];
            }

            else
            {
                w_this = w[*row];
                if (added == 0) m_prev = Xc[curr_pos];
                added += w_this;
                m = std::fma(w_this, (Xc[curr_pos] - m) / added, m);
                s = std::fma(w_this, (Xc[curr_pos] - m) * (Xc[curr_pos] - m_prev), s);
                m_prev = m;
            }

            if (row == ix_arr + end || curr_pos == end_col) break;
            curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
        }

        else
        {
            if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
            else
                curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
        }
    }

    if (added == 0)
    {
        x_mean = 0;
        x_sd = 0;
        return;
    }

    /* Note: up to this point:
         m = sum(x)/nnz
         s = sum(x^2) - (1/nnz)*(sum(x)^2)
       Here the standard deviation is given by:
         sigma = (1/n)*(sum(x^2) - (1/n)*(sum(x)^2))
       The difference can be put to a closed form. */
    if (cnt > added)
    {
        s += square(m) * (added * ((ldouble_safe)1 - (ldouble_safe)added/(ldouble_safe)cnt));
        m *= added / cnt;
    }

    x_mean = m;
    x_sd   = std::sqrt(s / (ldouble_safe)cnt);
}